

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_measures.cc
# Opt level: O0

S2Point * S2::GetCentroid(S2Point *__return_storage_ptr__,S2ShapeIndex *index)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  S2Point local_38;
  S2Shape *local_20;
  S2Shape *shape;
  int i;
  int dim;
  S2ShapeIndex *index_local;
  
  _i = index;
  shape._4_4_ = GetDimension(index);
  Vector3<double>::Vector3(__return_storage_ptr__);
  shape._0_4_ = 0;
  while( true ) {
    uVar1 = (uint)shape;
    iVar2 = (*_i->_vptr_S2ShapeIndex[2])();
    if (iVar2 <= (int)uVar1) break;
    iVar2 = (*_i->_vptr_S2ShapeIndex[3])(_i,(ulong)(uint)shape);
    local_20 = (S2Shape *)CONCAT44(extraout_var,iVar2);
    if (local_20 != (S2Shape *)0x0) {
      iVar2 = (*local_20->_vptr_S2Shape[4])();
      if (iVar2 == shape._4_4_) {
        GetCentroid(&local_38,local_20);
        util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+=
                  ((BasicVector<Vector3,_double,_3UL> *)__return_storage_ptr__,&local_38);
      }
    }
    shape._0_4_ = (uint)shape + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

S2Point GetCentroid(const S2ShapeIndex& index) {
  int dim = GetDimension(index);
  S2Point centroid;
  for (int i = 0; i < index.num_shape_ids(); ++i) {
    S2Shape* shape = index.shape(i);
    if (shape && shape->dimension() == dim) {
      centroid += S2::GetCentroid(*shape);
    }
  }
  return centroid;
}